

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

PackageMempoolAcceptResult * __thiscall
anon_unknown.dwarf_c13565::MemPoolAccept::AcceptMultipleTransactions
          (PackageMempoolAcceptResult *__return_storage_ptr__,MemPoolAccept *this,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *txns,ATMPArgs *args)

{
  optional<CFeeRate> *this_00;
  string *ws_00;
  CAmount *pCVar1;
  size_t *psVar2;
  long lVar3;
  element_type *peVar4;
  CTransactionRef *tx;
  CTransaction *tx_00;
  CTxMemPool *pCVar5;
  uint64_t mempool_sequence;
  ValidationSignals *this_01;
  CTxMemPoolEntry *this_02;
  PackageValidationState state;
  TxValidationState state_00;
  PackageValidationState state_01;
  PackageValidationState state_02;
  TxValidationState state_03;
  PackageValidationState state_04;
  TxValidationState state_05;
  PackageValidationState state_06;
  PackageValidationState state_07;
  TxValidationState state_08;
  PackageValidationState state_09;
  PackageValidationState state_10;
  TxValidationState state_11;
  TxValidationState state_12;
  TxValidationState state_13;
  PackageValidationState state_14;
  PackageValidationState state_15;
  setEntries *psVar6;
  bool bVar7;
  byte bVar8;
  bool chainstate_is_current;
  bool has_no_mempool_parents;
  bool bVar9;
  int32_t iVar10;
  pointer __result;
  pointer pWVar11;
  Workspace *pWVar12;
  pointer pWVar13;
  ValidationState<TxValidationResult> *pVVar14;
  CFeeRate *pCVar15;
  pointer pWVar16;
  long lVar17;
  int64_t vsize;
  size_type __n;
  _Base_ptr p_Var18;
  _Tp_alloc_type *p_Var19;
  string *limits;
  size_t __n_00;
  Workspace *__args;
  Workspace *__args_00;
  size_t __n_01;
  Workspace *extraout_RDX;
  Workspace *extraout_RDX_00;
  Workspace *extraout_RDX_01;
  Workspace *extraout_RDX_02;
  Workspace *extraout_RDX_03;
  Workspace *extraout_RDX_04;
  Workspace *extraout_RDX_05;
  Workspace *extraout_RDX_06;
  Workspace *extraout_RDX_07;
  Workspace *extraout_RDX_08;
  Workspace *extraout_RDX_09;
  Workspace *extraout_RDX_10;
  Workspace *extraout_RDX_11;
  Workspace *extraout_RDX_12;
  Workspace *extraout_RDX_13;
  Workspace *extraout_RDX_14;
  iterator __end1;
  __normal_iterator<const_(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
  _Var20;
  MemPoolAccept *this_03;
  ValidationState<PackageValidationResult> *pVVar21;
  pointer pWVar22;
  setEntries *__range1;
  _Rb_tree<_270907ca_> *this_04;
  __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
  __it;
  pointer ptx;
  string *this_05;
  CFeeRate relay_fee;
  Workspace *ws;
  _Tp_alloc_type *this_06;
  pointer pWVar23;
  __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
  _Var24;
  __normal_iterator<const_(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
  __it_00;
  _Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
  *this_07;
  ulong uVar25;
  shared_ptr<const_CTransaction> *psVar26;
  uint uVar27;
  long lVar28;
  pointer psVar29;
  undefined8 uVar30;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  initializer_list<std::pair<const_uint256,_MempoolAcceptResult>_> __l;
  initializer_list<transaction_identifier<true>_> __l_00;
  initializer_list<transaction_identifier<true>_> __l_01;
  undefined8 in_stack_fffffffffffff628;
  MemPoolAccept *pMVar31;
  pointer in_stack_fffffffffffff630;
  Workspace *__first;
  shared_ptr<const_CTransaction> *psVar32;
  undefined8 in_stack_fffffffffffff638;
  Workspace *__n_02;
  SubPackageState *nFeePaid;
  uint uVar33;
  undefined4 uVar34;
  undefined8 in_stack_fffffffffffff650;
  PackageMempoolAcceptResult *pPVar35;
  CTransactionRef *in_stack_fffffffffffff658;
  _List_node_base *replaced_txns;
  undefined8 in_stack_fffffffffffff660;
  pointer psVar36;
  int64_t in_stack_fffffffffffff668;
  CFeeRate local_990;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
  all_package_wtxids;
  CFeeRate package_feerate;
  vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
  local_968;
  FeeEstimateMode local_94c [2];
  allocator<char> local_941;
  CFeeRate package_feerate_1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock8;
  ValidationState<PackageValidationResult> local_928;
  ValidationState<PackageValidationResult> local_8e0;
  ValidationState<PackageValidationResult> local_898;
  ValidationState<PackageValidationResult> local_850;
  ValidationState<TxValidationResult> local_808;
  ValidationState<PackageValidationResult> local_7c0;
  ValidationState<TxValidationResult> local_778;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> err;
  ValidationState<PackageValidationResult> local_650;
  TxValidationState placeholder_state;
  ValidationState<PackageValidationResult> local_5c0;
  ValidationState<PackageValidationResult> local_578;
  ValidationState<TxValidationResult> local_530;
  ValidationState<PackageValidationResult> local_4e8;
  ValidationState<TxValidationResult> local_4a0;
  map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  results;
  ValidationState<PackageValidationResult> local_428;
  PackageValidationState package_state;
  Result<void> result;
  ValidationState<TxValidationResult> local_158;
  CFeeRate parent_feerate;
  ValidationState<TxValidationResult> local_f0;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  err_string;
  undefined1 local_80;
  __index_type local_68;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
  effective_feerate_wtxids_1;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  package_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                 field_2;
  package_state.super_ValidationState<PackageValidationResult>.m_mode = M_VALID;
  package_state.super_ValidationState<PackageValidationResult>.m_result = PCKG_RESULT_UNSET;
  package_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length = 0;
  package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._M_local_buf
  [0] = '\0';
  package_state.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                 field_2;
  package_state.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length = 0;
  package_state.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._M_local_buf
  [0] = '\0';
  bVar7 = IsWellFormedPackage(txns,&package_state,true);
  if (bVar7) {
    p_Var19 = (_Tp_alloc_type *)0x38e38e38e38e38;
    local_968.
    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (Workspace *)0x0;
    local_968.
    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ._M_impl.super__Vector_impl_data._M_start = (Workspace *)0x0;
    local_968.
    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ._M_impl.super__Vector_impl_data._M_finish = (Workspace *)0x0;
    ptx = (txns->
          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
    psVar29 = (txns->
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    this_07 = (_Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
               *)((long)psVar29 - (long)ptx >> 4);
    if ((_Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
         *)0x38e38e38e38e38 < this_07) {
LAB_00372dd1:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
        std::__throw_length_error("vector::reserve");
LAB_00372df4:
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
          std::__throw_bad_optional_access();
        }
      }
      goto LAB_00373724;
    }
    __result = local_968.
               super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    pWVar12 = local_968.
              super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    __n_02 = local_968.
             super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    psVar36 = psVar29;
    pWVar16 = local_968.
              super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar29 != ptx) {
      __result = std::
                 _Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                 ::_M_allocate(this_07,(size_t)ptx);
      std::
      vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
      ::_S_relocate((pointer)0x0,(pointer)0x0,__result,p_Var19);
      std::
      _Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
      ::_M_deallocate((_Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                       *)0x0,(pointer)0x0,__n_00);
      local_968.
      super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)this_07;
      ptx = (txns->
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
      psVar29 = (txns->
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      pWVar12 = __result;
      __n_02 = local_968.
               super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      psVar36 = psVar29;
      pWVar16 = __result;
      local_968.
      super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
      ._M_impl.super__Vector_impl_data._M_finish = __result;
    }
    while (local_968.
           super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
           ._M_impl.super__Vector_impl_data._M_start = pWVar16, ptx != psVar29) {
      Workspace::Workspace((Workspace *)&result,ptx);
      if (__result == __n_02) {
        lVar28 = (long)__n_02 - (long)pWVar12;
        if (lVar28 == 0x7ffffffffffffe00) {
          local_968.
          super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
          ._M_impl.super__Vector_impl_data._M_start = pWVar12;
          local_968.
          super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
          ._M_impl.super__Vector_impl_data._M_finish = __result;
          local_968.
          super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = __n_02;
          if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) goto LAB_00373724;
          std::__throw_length_error("vector::_M_realloc_insert");
          goto LAB_00372dd1;
        }
        pWVar11 = (pointer)(lVar28 / 0x240);
        pWVar16 = pWVar11;
        if (__n_02 == pWVar12) {
          pWVar16 = (pointer)&DAT_00000001;
        }
        p_Var19 = (_Tp_alloc_type *)
                  (&(pWVar16->m_conflicts)._M_t._M_impl.field_0x0 +
                  (long)&(pWVar11->m_conflicts)._M_t._M_impl.field_0x0);
        if ((_Tp_alloc_type *)0x38e38e38e38e37 < p_Var19) {
          p_Var19 = (_Tp_alloc_type *)0x38e38e38e38e38;
        }
        this_06 = (_Tp_alloc_type *)0x38e38e38e38e38;
        if (!CARRY8((ulong)pWVar16,(ulong)pWVar11)) {
          this_06 = p_Var19;
        }
        __first = pWVar12;
        pWVar12 = std::
                  _Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                  ::_M_allocate((_Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                                 *)this_06,(size_t)__n_02);
        std::allocator_traits<std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>::
        construct<(anonymous_namespace)::MemPoolAccept::Workspace,(anonymous_namespace)::MemPoolAccept::Workspace>
                  ((allocator_type *)(lVar28 + (long)pWVar12),(Workspace *)&result,__args_00);
        in_stack_fffffffffffff630 = __first;
        pWVar13 = std::
                  vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                  ::_S_relocate(__first,__result,pWVar12,p_Var19);
        __result = std::
                   vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                   ::_S_relocate(__result,__result,pWVar13 + 1,(_Tp_alloc_type *)0x240);
        psVar29 = psVar36;
        std::
        _Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
        ::_M_deallocate((_Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                         *)__first,pWVar11,__n_01);
        __n_02 = pWVar12 + (long)this_06;
        in_stack_fffffffffffff658 = ptx;
        psVar36 = psVar29;
      }
      else {
        std::allocator_traits<std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>::
        construct<(anonymous_namespace)::MemPoolAccept::Workspace,(anonymous_namespace)::MemPoolAccept::Workspace>
                  ((allocator_type *)__result,(Workspace *)&result,__args);
        __result = __result + 1;
        in_stack_fffffffffffff658 = ptx;
      }
      Workspace::~Workspace((Workspace *)&result);
      pWVar16 = local_968.
                super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ptx = in_stack_fffffffffffff658 + 1;
    }
    results._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &results._M_t._M_impl.super__Rb_tree_header._M_header;
    results._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    results._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    results._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    this_03 = this;
    local_968.
    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ._M_impl.super__Vector_impl_data._M_start = pWVar12;
    local_968.
    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ._M_impl.super__Vector_impl_data._M_finish = __result;
    local_968.
    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __n_02;
    results._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         results._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock8,&this->m_pool->cs,"m_pool.cs",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
               ,0x5ed,false);
    this_00 = &args->m_client_maxfeerate;
    for (pVVar14 = &(pWVar12->m_state).super_ValidationState<TxValidationResult>;
        pWVar16 = local_968.
                  super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
        (pointer)&pVVar14[-3].m_reject_reason != __result; pVVar14 = pVVar14 + 8) {
      bVar7 = PreChecks(this_03,args,(Workspace *)&pVVar14[-3].m_reject_reason);
      if (!bVar7) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&result,"transaction failed",(allocator<char> *)&err_string);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&err,"",(allocator<char> *)&local_f0);
        ValidationState<PackageValidationResult>::Invalid
                  (&package_state.super_ValidationState<PackageValidationResult>,PCKG_TX,
                   (string *)&result,(string *)&err);
        std::__cxx11::string::~string((string *)&err);
        std::__cxx11::string::~string((string *)&result);
        lVar28 = **(long **)&pVVar14[-1].m_debug_message.field_2;
        ValidationState<TxValidationResult>::ValidationState(&local_4a0,pVVar14);
        state_00.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
             (pointer)in_stack_fffffffffffff630;
        state_00.super_ValidationState<TxValidationResult>._0_8_ = this_03;
        state_00.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length =
             (size_type)__n_02;
        state_00.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity._0_4_ = (int)txns;
        state_00.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity._4_4_ = (int)((ulong)txns >> 0x20);
        state_00.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ = args;
        state_00.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
             (pointer)__return_storage_ptr__;
        state_00.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length =
             (size_type)in_stack_fffffffffffff658;
        state_00.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
        _M_allocated_capacity = (size_type)psVar36;
        state_00.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
             in_stack_fffffffffffff668;
        MempoolAcceptResult::Failure((MempoolAcceptResult *)&result,state_00);
        std::
        _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
        ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                  ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                    *)&results,(transaction_identifier<true> *)(lVar28 + 0x59),
                   (MempoolAcceptResult *)&result);
        MempoolAcceptResult::~MempoolAcceptResult((MempoolAcceptResult *)&result);
        ValidationState<TxValidationResult>::~ValidationState(&local_4a0);
        ValidationState<PackageValidationResult>::ValidationState
                  (&local_4e8,&package_state.super_ValidationState<PackageValidationResult>);
        state_01.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
             (pointer)in_stack_fffffffffffff630;
        state_01.super_ValidationState<PackageValidationResult>._0_8_ = this_03;
        state_01.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
             (size_type)__n_02;
        state_01.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity._0_4_ = (int)txns;
        state_01.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity._4_4_ = (int)((ulong)txns >> 0x20);
        state_01.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ = args
        ;
        state_01.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
             (pointer)__return_storage_ptr__;
        state_01.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
             (size_type)in_stack_fffffffffffff658;
        state_01.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
        _M_allocated_capacity = (size_type)psVar36;
        state_01.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
             in_stack_fffffffffffff668;
        PackageMempoolAcceptResult::PackageMempoolAcceptResult
                  (__return_storage_ptr__,state_01,
                   (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                    *)&local_4e8);
        pVVar21 = &local_4e8;
LAB_003718dc:
        ValidationState<PackageValidationResult>::~ValidationState(pVVar21);
        goto LAB_00372805;
      }
      if ((args->m_client_maxfeerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
          super__Optional_payload_base<CFeeRate>._M_engaged == true) {
        CFeeRate::CFeeRate((CFeeRate *)&result,(CAmount *)&pVVar14[-1].m_debug_message,
                           *(uint32_t *)&pVVar14[-1].m_reject_reason.field_2);
        pCVar15 = std::optional<CFeeRate>::value(this_00);
        if (pCVar15->nSatoshisPerK <
            (long)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&result,"max feerate exceeded",(allocator<char> *)&err_string);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&err,"",(allocator<char> *)&local_f0);
          ValidationState<TxValidationResult>::Invalid
                    (pVVar14,TX_MEMPOOL_POLICY,(string *)&result,(string *)&err);
          std::__cxx11::string::~string((string *)&err);
          std::__cxx11::string::~string((string *)&result);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&result,"transaction failed",(allocator<char> *)&err_string);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&err,"",(allocator<char> *)&local_f0);
          ValidationState<PackageValidationResult>::Invalid
                    (&package_state.super_ValidationState<PackageValidationResult>,PCKG_TX,
                     (string *)&result,(string *)&err);
          std::__cxx11::string::~string((string *)&err);
          std::__cxx11::string::~string((string *)&result);
          lVar28 = **(long **)&pVVar14[-1].m_debug_message.field_2;
          ValidationState<TxValidationResult>::ValidationState(&local_530,pVVar14);
          state_03.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
               (pointer)in_stack_fffffffffffff630;
          state_03.super_ValidationState<TxValidationResult>._0_8_ = this_03;
          state_03.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length =
               (size_type)__n_02;
          state_03.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity._0_4_ = (int)txns;
          state_03.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity._4_4_ = (int)((ulong)txns >> 0x20);
          state_03.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ = args;
          state_03.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
               (pointer)__return_storage_ptr__;
          state_03.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length =
               (size_type)in_stack_fffffffffffff658;
          state_03.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
          _M_allocated_capacity = (size_type)psVar36;
          state_03.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
               in_stack_fffffffffffff668;
          MempoolAcceptResult::Failure((MempoolAcceptResult *)&result,state_03);
          std::
          _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
          ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                    ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                      *)&results,(transaction_identifier<true> *)(lVar28 + 0x59),
                     (MempoolAcceptResult *)&result);
          MempoolAcceptResult::~MempoolAcceptResult((MempoolAcceptResult *)&result);
          ValidationState<TxValidationResult>::~ValidationState(&local_530);
          ValidationState<PackageValidationResult>::ValidationState
                    (&local_578,&package_state.super_ValidationState<PackageValidationResult>);
          state_04.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
               (pointer)in_stack_fffffffffffff630;
          state_04.super_ValidationState<PackageValidationResult>._0_8_ = this_03;
          state_04.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
               (size_type)__n_02;
          state_04.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity._0_4_ = (int)txns;
          state_04.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity._4_4_ = (int)((ulong)txns >> 0x20);
          state_04.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ =
               args;
          state_04.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
               (pointer)__return_storage_ptr__;
          state_04.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
               (size_type)in_stack_fffffffffffff658;
          state_04.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
          _M_allocated_capacity = (size_type)psVar36;
          state_04.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
               in_stack_fffffffffffff668;
          PackageMempoolAcceptResult::PackageMempoolAcceptResult
                    (__return_storage_ptr__,state_04,
                     (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                      *)&local_578);
          pVVar21 = &local_578;
          goto LAB_003718dc;
        }
      }
      CCoinsViewMemPool::PackageAddTransaction
                (&this->m_viewmempool,
                 (CTransactionRef *)pVVar14[-1].m_debug_message.field_2._M_allocated_capacity);
    }
    for (pWVar11 = local_968.
                   super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pWVar22 = local_968.
                  super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
        pWVar23 = local_968.
                  super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                  ._M_impl.super__Vector_impl_data._M_start, pWVar11 != pWVar16;
        pWVar11 = pWVar11 + 1) {
      PackageTRUCChecks_abi_cxx11_(&err,pWVar11->m_ptx,pWVar11->m_vsize,txns,&pWVar11->m_ancestors);
      if (err.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged == true) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&result,"TRUC-violation",(allocator<char> *)&err_string);
        if (err.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged == false) goto LAB_00372df4;
        pPVar35 = __return_storage_ptr__;
        ValidationState<PackageValidationResult>::Invalid
                  (&package_state.super_ValidationState<PackageValidationResult>,PCKG_POLICY,
                   (string *)&result,(string *)&err);
        std::__cxx11::string::~string((string *)&result);
        ValidationState<PackageValidationResult>::ValidationState
                  (&local_5c0,&package_state.super_ValidationState<PackageValidationResult>);
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._24_8_ =
             (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                    super__Copy_ctor_alias<bilingual_str,_std::monostate> + 8;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ = 0;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_8_ = 0;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._16_8_ = 0;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._40_8_ = 0;
        state_02.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
             (pointer)in_stack_fffffffffffff630;
        state_02.super_ValidationState<PackageValidationResult>._0_8_ = this_03;
        state_02.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
             (size_type)__n_02;
        state_02.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity._0_4_ = (int)txns;
        state_02.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity._4_4_ = (int)((ulong)txns >> 0x20);
        state_02.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ = args
        ;
        state_02.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
             (pointer)pPVar35;
        state_02.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
             (size_type)in_stack_fffffffffffff658;
        state_02.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
        _M_allocated_capacity = (size_type)psVar36;
        state_02.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
             in_stack_fffffffffffff668;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_ =
             result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._24_8_;
        PackageMempoolAcceptResult::PackageMempoolAcceptResult
                  (__return_storage_ptr__,state_02,
                   (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                    *)&local_5c0);
        std::
        _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
        ::~_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                     *)&result);
        ValidationState<PackageValidationResult>::~ValidationState(&local_5c0);
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&err);
        goto LAB_00372805;
      }
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&err);
    }
    lVar28 = 0;
    for (pWVar16 = local_968.
                   super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pWVar16 !=
        local_968.
        super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
        ._M_impl.super__Vector_impl_data._M_finish; pWVar16 = pWVar16 + 1) {
      lVar28 = lVar28 + pWVar16->m_vsize;
    }
    (this_03->m_subpackage).m_total_vsize = lVar28;
    lVar17 = 0;
    for (pWVar16 = local_968.
                   super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pWVar16 !=
        local_968.
        super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
        ._M_impl.super__Vector_impl_data._M_finish; pWVar16 = pWVar16 + 1) {
      lVar17 = lVar17 + pWVar16->m_modified_fees;
    }
    nFeePaid = &this_03->m_subpackage;
    (this_03->m_subpackage).m_total_modified_fees = lVar17;
    CFeeRate::CFeeRate(&package_feerate,&nFeePaid->m_total_modified_fees,(uint32_t)lVar28);
    all_package_wtxids.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    all_package_wtxids.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    all_package_wtxids.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vsize = (long)pWVar22 - (long)pWVar23;
    __n = vsize / 0x240;
    std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
    reserve(&all_package_wtxids,__n);
    pWVar12 = extraout_RDX;
    for (pWVar16 = pWVar23; pWVar16 != pWVar22; pWVar16 = pWVar16 + 1) {
      peVar4 = (pWVar16->m_ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
           *(undefined8 *)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_8_ =
           *(undefined8 *)
            ((long)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._16_8_ =
           *(undefined8 *)
            ((long)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._24_8_ =
           *(undefined8 *)
            ((long)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      std::vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>::
      emplace_back<transaction_identifier<true>>
                ((vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>
                  *)&all_package_wtxids,(transaction_identifier<true> *)&result);
      pWVar12 = extraout_RDX_00;
    }
    placeholder_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)&placeholder_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                   field_2;
    placeholder_state.super_ValidationState<TxValidationResult>.m_mode = M_VALID;
    placeholder_state.super_ValidationState<TxValidationResult>.m_result = TX_RESULT_UNSET;
    placeholder_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length = 0
    ;
    placeholder_state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._M_local_buf
    [0] = '\0';
    placeholder_state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)&placeholder_state.super_ValidationState<TxValidationResult>.m_debug_message.
                   field_2;
    placeholder_state.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length = 0
    ;
    placeholder_state.super_ValidationState<TxValidationResult>.m_debug_message.field_2._M_local_buf
    [0] = '\0';
    if ((args->m_package_feerates != true) ||
       (bVar7 = CheckFeeRate(this_03,(this_03->m_subpackage).m_total_vsize,
                             (this_03->m_subpackage).m_total_modified_fees,&placeholder_state),
       pWVar12 = extraout_RDX_01, bVar7)) {
      __it._M_current =
           (txns->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      psVar26 = (txns->
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      uVar25 = (long)psVar26 - (long)__it._M_current;
      pWVar16 = pWVar22;
      if (0x10 < uVar25) {
        in_stack_fffffffffffff668 = (this_03->m_subpackage).m_total_vsize;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ = this_03;
        for (lVar28 = (long)uVar25 >> 6; _Var24._M_current = __it._M_current, 0 < lVar28;
            lVar28 = lVar28 + -1) {
          bVar7 = __gnu_cxx::__ops::
                  _Iter_negate<(anonymous_namespace)::MemPoolAccept::PackageMempoolChecks(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,long,PackageValidationState&)::$_0>
                  ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::PackageMempoolChecks(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,long,PackageValidationState&)::__0>
                                *)&result,__it);
          psVar32 = psVar26;
          if (bVar7) goto LAB_00371ab6;
          bVar7 = __gnu_cxx::__ops::
                  _Iter_negate<(anonymous_namespace)::MemPoolAccept::PackageMempoolChecks(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,long,PackageValidationState&)::$_0>
                  ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::PackageMempoolChecks(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,long,PackageValidationState&)::__0>
                                *)&result,__it._M_current + 1);
          _Var24._M_current = __it._M_current + 1;
          psVar32 = psVar26;
          if (bVar7) goto LAB_00371ab6;
          bVar7 = __gnu_cxx::__ops::
                  _Iter_negate<(anonymous_namespace)::MemPoolAccept::PackageMempoolChecks(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,long,PackageValidationState&)::$_0>
                  ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::PackageMempoolChecks(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,long,PackageValidationState&)::__0>
                                *)&result,__it._M_current + 2);
          _Var24._M_current = __it._M_current + 2;
          psVar32 = psVar26;
          if (bVar7) goto LAB_00371ab6;
          bVar7 = __gnu_cxx::__ops::
                  _Iter_negate<(anonymous_namespace)::MemPoolAccept::PackageMempoolChecks(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,long,PackageValidationState&)::$_0>
                  ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::PackageMempoolChecks(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,long,PackageValidationState&)::__0>
                                *)&result,__it._M_current + 3);
          _Var24._M_current = __it._M_current + 3;
          psVar32 = psVar26;
          if (bVar7) goto LAB_00371ab6;
          __it._M_current = __it._M_current + 4;
          uVar25 = uVar25 - 0x40;
        }
        lVar28 = (long)uVar25 >> 4;
        psVar32 = psVar26;
        if (lVar28 == 1) {
LAB_00372886:
          bVar7 = __gnu_cxx::__ops::
                  _Iter_negate<(anonymous_namespace)::MemPoolAccept::PackageMempoolChecks(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,long,PackageValidationState&)::$_0>
                  ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::PackageMempoolChecks(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,long,PackageValidationState&)::__0>
                                *)&result,__it);
          _Var24._M_current = __it._M_current;
          if (!bVar7) {
            _Var24._M_current = psVar26;
          }
LAB_00371ab6:
          bVar7 = _Var24._M_current != psVar26;
          psVar26 = psVar32;
          if (bVar7) {
            __assert_fail("std::all_of(txns.cbegin(), txns.cend(), [this](const auto& tx) { return !m_pool.exists(GenTxid::Txid(tx->GetHash()));})"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                          ,0x475,
                          "bool (anonymous namespace)::MemPoolAccept::PackageMempoolChecks(const std::vector<CTransactionRef> &, std::vector<Workspace> &, const int64_t, PackageValidationState &)"
                         );
          }
        }
        else {
          if (lVar28 == 2) {
LAB_00372867:
            psVar32 = psVar26;
            bVar7 = __gnu_cxx::__ops::
                    _Iter_negate<(anonymous_namespace)::MemPoolAccept::PackageMempoolChecks(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,long,PackageValidationState&)::$_0>
                    ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::PackageMempoolChecks(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,long,PackageValidationState&)::__0>
                                  *)&result,__it);
            _Var24._M_current = __it._M_current;
            if (!bVar7) {
              __it._M_current = __it._M_current + 1;
              goto LAB_00372886;
            }
            goto LAB_00371ab6;
          }
          if (lVar28 == 3) {
            bVar7 = __gnu_cxx::__ops::
                    _Iter_negate<(anonymous_namespace)::MemPoolAccept::PackageMempoolChecks(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,long,PackageValidationState&)::$_0>
                    ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::PackageMempoolChecks(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,long,PackageValidationState&)::__0>
                                  *)&result,__it);
            psVar32 = psVar26;
            if (!bVar7) {
              __it._M_current = __it._M_current + 1;
              goto LAB_00372867;
            }
            goto LAB_00371ab6;
          }
        }
        if ((long)(txns->
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(txns->
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 4 != __n) {
          __assert_fail("txns.size() == workspaces.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x477,
                        "bool (anonymous namespace)::MemPoolAccept::PackageMempoolChecks(const std::vector<CTransactionRef> &, std::vector<Workspace> &, const int64_t, PackageValidationState &)"
                       );
        }
        CTxMemPool::CheckPackageLimits(&result,this_03->m_pool,txns,in_stack_fffffffffffff668);
        if (result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_index != '\x01') {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&err_string,"package-mempool-limits",(allocator<char> *)&local_f0);
          util::ErrorString<void>((bilingual_str *)&err,&result);
          bVar7 = ValidationState<PackageValidationResult>::Invalid
                            (&package_state.super_ValidationState<PackageValidationResult>,
                             PCKG_POLICY,(string *)&err_string,(string *)&err);
          bilingual_str::~bilingual_str((bilingual_str *)&err);
          this_05 = (string *)&err_string;
          goto LAB_00371c9b;
        }
        if ((this_03->m_subpackage).m_rbf == true) {
          if ((vsize == 0x480) && (bVar7 = IsChildWithParents(txns), pWVar12 = pWVar23, bVar7)) {
LAB_00371b36:
            if (pWVar12 != pWVar22) goto code_r0x00371b3f;
            err.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._24_8_ =
                 (long)&err.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload + 8;
            err.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_string_length._0_4_ = 0;
            err.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._16_8_ = 0;
            err.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._32_8_ = err.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._24_8_;
            for (pWVar16 = pWVar23;
                pWVar23 = local_968.
                          super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                          ._M_impl.super__Vector_impl_data._M_start, pWVar16 != pWVar22;
                pWVar16 = pWVar16 + 1) {
              std::_Rb_tree<$270907ca$>::_M_merge_unique<CompareIteratorByHash>
                        ((_Rb_tree<_270907ca_> *)&err,&(pWVar16->m_iters_conflicting)._M_t);
            }
            psVar6 = &(this_03->m_subpackage).m_all_conflicts;
            GetEntriesForConflicts_abi_cxx11_
                      (&err_string,
                       ((local_968.
                         super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].m_ptx)->
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                       this_03->m_pool,(setEntries *)&err,psVar6);
            bVar7 = err_string.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_engaged;
            if (err_string.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_engaged == true) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_f0,"package RBF failed: too many potential replacements",
                         (allocator<char> *)&local_158);
              bVar9 = ValidationState<PackageValidationResult>::Invalid
                                (&package_state.super_ValidationState<PackageValidationResult>,
                                 PCKG_POLICY,(string *)&local_f0,(string *)&err_string);
              pWVar22 = (pointer)(ulong)bVar9;
              std::__cxx11::string::~string((string *)&local_f0);
            }
            std::
            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&err_string);
            if (bVar7 == false) {
              pMVar31 = this_03;
              for (p_Var18 = (this_03->m_subpackage).m_all_conflicts._M_t._M_impl.
                             super__Rb_tree_header._M_header._M_left;
                  (_Rb_tree_header *)p_Var18 !=
                  &(this_03->m_subpackage).m_all_conflicts._M_t._M_impl.super__Rb_tree_header;
                  p_Var18 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var18)) {
                this_02 = *(CTxMemPoolEntry **)(p_Var18 + 1);
                pCVar1 = &(this_03->m_subpackage).m_conflicting_fees;
                *pCVar1 = *pCVar1 + this_02->m_modified_fee;
                iVar10 = CTxMemPoolEntry::GetTxSize(this_02);
                psVar2 = &(this_03->m_subpackage).m_conflicting_size;
                *psVar2 = *psVar2 + (long)iVar10;
              }
              relay_fee.nSatoshisPerK =
                   (pMVar31->m_pool->m_opts).incremental_relay_feerate.nSatoshisPerK;
              PaysForRBF_abi_cxx11_
                        (&err_string,(pMVar31->m_subpackage).m_conflicting_fees,
                         (pMVar31->m_subpackage).m_total_modified_fees,
                         (pMVar31->m_subpackage).m_total_vsize,relay_fee,
                         &((((pWVar23[1].m_ptx)->
                            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr)->hash).m_wrapped);
              this_03 = pMVar31;
              if (err_string.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_engaged == true) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_f0,"package RBF failed: insufficient anti-DoS fees",
                           (allocator<char> *)&local_158);
                bVar7 = ValidationState<PackageValidationResult>::Invalid
                                  (&package_state.super_ValidationState<PackageValidationResult>,
                                   PCKG_POLICY,(string *)&local_f0,(string *)&err_string);
                pWVar22 = (pointer)(ulong)bVar7;
                std::__cxx11::string::~string((string *)&local_f0);
                this_03 = pMVar31;
              }
              std::
              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&err_string);
              if (err_string.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_engaged == false) {
                CFeeRate::CFeeRate(&parent_feerate,&pWVar23->m_modified_fees,
                                   (uint32_t)pWVar23->m_vsize);
                CFeeRate::CFeeRate(&package_feerate_1,&nFeePaid->m_total_modified_fees,
                                   (uint32_t)(this_03->m_subpackage).m_total_vsize);
                if (parent_feerate.nSatoshisPerK < package_feerate_1.nSatoshisPerK) {
                  ImprovesFeerateDiagram_abi_cxx11_
                            ((optional<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&err_string,this_03->m_pool,(setEntries *)&err,psVar6,
                             (this_03->m_subpackage).m_total_modified_fees,
                             (this_03->m_subpackage).m_total_vsize);
                  if (local_80 == '\x01') {
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_f0,"package RBF failed: ",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)&err_string.
                                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                              .
                                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              ._M_payload + 8));
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_158,"",
                               (allocator<char> *)&effective_feerate_wtxids_1);
                    bVar7 = ValidationState<PackageValidationResult>::Invalid
                                      (&package_state.super_ValidationState<PackageValidationResult>
                                       ,PCKG_POLICY,(string *)&local_f0,(string *)&local_158);
                    pWVar22 = (pointer)(ulong)bVar7;
                    std::__cxx11::string::~string((string *)&local_158);
                    std::__cxx11::string::~string((string *)&local_f0);
                  }
                  std::
                  _Optional_payload_base<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::_M_reset((_Optional_payload_base<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&err_string);
                  if (local_80 == '\0') {
                    bVar7 = ::LogAcceptCategory(TXPACKAGES,Debug);
                    pWVar22 = (pointer)&DAT_00000001;
                    if (bVar7) {
                      base_blob<256u>::ToString_abi_cxx11_
                                ((string *)&err_string,
                                 (base_blob<256u> *)
                                 &((((txns->
                                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->
                                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->hash);
                      base_blob<256u>::ToString_abi_cxx11_
                                ((string *)&local_f0,
                                 (base_blob<256u> *)
                                 &((((txns->
                                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->
                                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->m_witness_hash);
                      base_blob<256u>::ToString_abi_cxx11_
                                ((string *)&local_158,
                                 (base_blob<256u> *)
                                 &((txns->
                                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish[-1].
                                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->hash);
                      base_blob<256u>::ToString_abi_cxx11_
                                ((string *)&effective_feerate_wtxids_1,
                                 (base_blob<256u> *)
                                 &((txns->
                                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish[-1].
                                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->m_witness_hash);
                      logging_function_00._M_str = "PackageMempoolChecks";
                      logging_function_00._M_len = 0x14;
                      source_file_00._M_str =
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ;
                      source_file_00._M_len = 0x5e;
                      LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                                (logging_function_00,source_file_00,0x4c5,TXPACKAGES,Debug,
                                 (ConstevalFormatString<4U>)0x6c75f5,(string *)&err_string,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_f0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_158,(string *)&effective_feerate_wtxids_1);
                      std::__cxx11::string::~string((string *)&effective_feerate_wtxids_1);
                      std::__cxx11::string::~string((string *)&local_158);
                      pVVar14 = &local_f0;
                      goto LAB_00372d78;
                    }
                  }
                }
                else {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&err_string,
                             "package RBF failed: package feerate is less than or equal to parent feerate"
                             ,&local_941);
                  local_94c[1] = 3;
                  CFeeRate::ToString_abi_cxx11_
                            ((string *)&local_158,&package_feerate_1,local_94c + 1);
                  local_94c[0] = BTC_KVB;
                  CFeeRate::ToString_abi_cxx11_
                            ((string *)&effective_feerate_wtxids_1,&parent_feerate,local_94c);
                  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                            ((string *)&local_f0,
                             (tinyformat *)"package feerate %s <= parent feerate is %s",
                             (char *)&local_158,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &effective_feerate_wtxids_1,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             relay_fee.nSatoshisPerK);
                  bVar7 = ValidationState<PackageValidationResult>::Invalid
                                    (&package_state.super_ValidationState<PackageValidationResult>,
                                     PCKG_POLICY,(string *)&err_string,(string *)&local_f0);
                  pWVar22 = (pointer)(ulong)bVar7;
                  std::__cxx11::string::~string((string *)&local_f0);
                  std::__cxx11::string::~string((string *)&effective_feerate_wtxids_1);
                  pVVar14 = &local_158;
LAB_00372d78:
                  std::__cxx11::string::~string((string *)pVVar14);
                  std::__cxx11::string::~string((string *)&err_string);
                }
              }
            }
            std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&err);
            goto LAB_00371ca0;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&err,"package RBF failed: package must be 1-parent-1-child",
                     (allocator<char> *)&local_f0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&err_string,"",(allocator<char> *)&local_158);
          bVar7 = ValidationState<PackageValidationResult>::Invalid
                            (&package_state.super_ValidationState<PackageValidationResult>,
                             PCKG_POLICY,(string *)&err,(string *)&err_string);
          goto LAB_00371c84;
        }
        std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
        ~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::monostate> *)&result);
        pWVar12 = extraout_RDX_02;
      }
      goto LAB_00371cbb;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result,"transaction failed",(allocator<char> *)&err_string);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&err,"",(allocator<char> *)&local_f0);
    ValidationState<PackageValidationResult>::Invalid
              (&package_state.super_ValidationState<PackageValidationResult>,PCKG_TX,
               (string *)&result,(string *)&err);
    std::__cxx11::string::~string((string *)&err);
    std::__cxx11::string::~string((string *)&result);
    ValidationState<PackageValidationResult>::ValidationState
              (&local_650,&package_state.super_ValidationState<PackageValidationResult>);
    peVar4 = ((pWVar22[-1].m_ptx)->
             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    ValidationState<TxValidationResult>::ValidationState
              (&local_778,&placeholder_state.super_ValidationState<TxValidationResult>);
    CFeeRate::CFeeRate(&local_990,&nFeePaid->m_total_modified_fees,
                       (uint32_t)(this_03->m_subpackage).m_total_vsize);
    state_05.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)in_stack_fffffffffffff630;
    state_05.super_ValidationState<TxValidationResult>._0_8_ = this_03;
    state_05.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length =
         (size_type)nFeePaid;
    state_05.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._M_allocated_capacity
    ._0_4_ = (int)txns;
    state_05.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._M_allocated_capacity
    ._4_4_ = (int)((ulong)txns >> 0x20);
    state_05.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ = args;
    state_05.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)__return_storage_ptr__;
    state_05.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length = __n;
    state_05.super_ValidationState<TxValidationResult>.m_debug_message.field_2._M_allocated_capacity
         = vsize;
    state_05.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
         in_stack_fffffffffffff668;
    MempoolAcceptResult::FeeFailure
              ((MempoolAcceptResult *)&err,state_05,(CFeeRate)&local_778,
               (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                *)local_990.nSatoshisPerK);
    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
         *(undefined8 *)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_8_ =
         *(undefined8 *)
          ((long)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._16_8_ =
         *(undefined8 *)
          ((long)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._24_8_ =
         *(undefined8 *)
          ((long)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
    MempoolAcceptResult::MempoolAcceptResult
              ((MempoolAcceptResult *)
               ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x20),
               (MempoolAcceptResult *)&err);
    __l._M_len = 1;
    __l._M_array = (iterator)&result;
    std::
    map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
    ::map((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
           *)&err_string,__l,(less<uint256> *)&local_f0,(allocator_type *)&local_158);
    pVVar21 = &local_650;
    state_06.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)in_stack_fffffffffffff630;
    state_06.super_ValidationState<PackageValidationResult>._0_8_ = this_03;
    state_06.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
         (size_type)nFeePaid;
    state_06.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
    _M_allocated_capacity._0_4_ = (int)txns;
    state_06.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
    _M_allocated_capacity._4_4_ = (int)((ulong)txns >> 0x20);
    state_06.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ = args;
    state_06.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)__return_storage_ptr__;
    state_06.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length = __n;
    state_06.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
    _M_allocated_capacity = vsize;
    state_06.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
         in_stack_fffffffffffff668;
    PackageMempoolAcceptResult::PackageMempoolAcceptResult
              (__return_storage_ptr__,state_06,
               (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                *)pVVar21);
    std::
    _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
    ::~_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                 *)&err_string);
    MempoolAcceptResult::~MempoolAcceptResult
              ((MempoolAcceptResult *)
               ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x20));
    MempoolAcceptResult::~MempoolAcceptResult((MempoolAcceptResult *)&err);
    ValidationState<TxValidationResult>::~ValidationState(&local_778);
    goto LAB_003727e1;
  }
  ValidationState<PackageValidationResult>::ValidationState
            (&local_428,&package_state.super_ValidationState<PackageValidationResult>);
  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
  super__Move_assign_alias<bilingual_str,_std::monostate>.
  super__Copy_assign_alias<bilingual_str,_std::monostate>.
  super__Move_ctor_alias<bilingual_str,_std::monostate>.
  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._24_8_ =
       (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate> + 8;
  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
  super__Move_assign_alias<bilingual_str,_std::monostate>.
  super__Copy_assign_alias<bilingual_str,_std::monostate>.
  super__Move_ctor_alias<bilingual_str,_std::monostate>.
  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ = 0;
  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
  super__Move_assign_alias<bilingual_str,_std::monostate>.
  super__Copy_assign_alias<bilingual_str,_std::monostate>.
  super__Move_ctor_alias<bilingual_str,_std::monostate>.
  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_8_ = 0;
  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
  super__Move_assign_alias<bilingual_str,_std::monostate>.
  super__Copy_assign_alias<bilingual_str,_std::monostate>.
  super__Move_ctor_alias<bilingual_str,_std::monostate>.
  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._16_8_ = 0;
  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
  super__Move_assign_alias<bilingual_str,_std::monostate>.
  super__Copy_assign_alias<bilingual_str,_std::monostate>.
  super__Move_ctor_alias<bilingual_str,_std::monostate>.
  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._40_8_ = 0;
  state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)in_stack_fffffffffffff630;
  state.super_ValidationState<PackageValidationResult>.m_mode = (int)in_stack_fffffffffffff628;
  state.super_ValidationState<PackageValidationResult>.m_result =
       (int)((ulong)in_stack_fffffffffffff628 >> 0x20);
  state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       in_stack_fffffffffffff638;
  state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._M_allocated_capacity
  ._0_4_ = (int)txns;
  state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._M_allocated_capacity
  ._4_4_ = (int)((ulong)txns >> 0x20);
  state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ = args;
  state.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)in_stack_fffffffffffff650;
  state.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
       (size_type)in_stack_fffffffffffff658;
  state.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._M_allocated_capacity
       = in_stack_fffffffffffff660;
  state.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
       in_stack_fffffffffffff668;
  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
  super__Move_assign_alias<bilingual_str,_std::monostate>.
  super__Copy_assign_alias<bilingual_str,_std::monostate>.
  super__Move_ctor_alias<bilingual_str,_std::monostate>.
  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_ =
       result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
       super__Move_assign_alias<bilingual_str,_std::monostate>.
       super__Copy_assign_alias<bilingual_str,_std::monostate>.
       super__Move_ctor_alias<bilingual_str,_std::monostate>.
       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
       super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._24_8_;
  PackageMempoolAcceptResult::PackageMempoolAcceptResult
            (__return_storage_ptr__,state,
             (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
              *)&local_428);
  std::
  _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  ::~_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
               *)&result);
  ValidationState<PackageValidationResult>::~ValidationState(&local_428);
  goto LAB_00372829;
code_r0x00371b3f:
  psVar6 = &pWVar12->m_ancestors;
  pWVar12 = pWVar12 + 1;
  if ((psVar6->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) goto LAB_00371b50;
  goto LAB_00371b36;
LAB_00371b50:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&err,"package RBF failed: new transaction cannot have mempool ancestors",
             (allocator<char> *)&local_f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&err_string,"",(allocator<char> *)&local_158);
  bVar7 = ValidationState<PackageValidationResult>::Invalid
                    (&package_state.super_ValidationState<PackageValidationResult>,PCKG_POLICY,
                     (string *)&err,(string *)&err_string);
LAB_00371c84:
  std::__cxx11::string::~string((string *)&err_string);
  this_05 = (string *)&err;
LAB_00371c9b:
  pWVar22 = (pointer)(ulong)bVar7;
  std::__cxx11::string::~string(this_05);
LAB_00371ca0:
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
  ~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::monostate> *)&result);
  pWVar12 = extraout_RDX_03;
  pWVar16 = local_968.
            super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (((ulong)pWVar22 & 1) == 0) {
    pVVar21 = &local_7c0;
    ValidationState<PackageValidationResult>::ValidationState
              (pVVar21,&package_state.super_ValidationState<PackageValidationResult>);
    state_10.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)psVar26;
    state_10.super_ValidationState<PackageValidationResult>._0_8_ = this_03;
    state_10.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
         (size_type)nFeePaid;
    state_10.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
    _M_allocated_capacity._0_4_ = (int)txns;
    state_10.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
    _M_allocated_capacity._4_4_ = (int)((ulong)txns >> 0x20);
    state_10.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ = args;
    state_10.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)__return_storage_ptr__;
    state_10.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length = __n;
    state_10.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
    _M_allocated_capacity = vsize;
    state_10.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
         in_stack_fffffffffffff668;
    PackageMempoolAcceptResult::PackageMempoolAcceptResult
              (__return_storage_ptr__,state_10,
               (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                *)pVVar21);
  }
  else {
LAB_00371cbb:
    replaced_txns = (_List_node_base *)&(this_03->m_subpackage).m_replaced_transactions;
    for (pVVar14 = &(pWVar23->m_state).super_ValidationState<TxValidationResult>;
        pWVar11 = local_968.
                  super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        (pointer)&pVVar14[-3].m_reject_reason != pWVar16; pVVar14 = pVVar14 + 8) {
      pVVar14[-1].m_debug_message._M_string_length = package_feerate.nSatoshisPerK;
      bVar7 = PolicyScriptChecks(this_03,(ATMPArgs *)&pVVar14[-3].m_reject_reason,pWVar12);
      if (!bVar7) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&result,"transaction failed",(allocator<char> *)&err_string);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&err,"",(allocator<char> *)&local_f0);
        ValidationState<PackageValidationResult>::Invalid
                  (&package_state.super_ValidationState<PackageValidationResult>,PCKG_TX,
                   (string *)&result,(string *)&err);
        std::__cxx11::string::~string((string *)&err);
        std::__cxx11::string::~string((string *)&result);
        lVar28 = **(long **)&pVVar14[-1].m_debug_message.field_2;
        ValidationState<TxValidationResult>::ValidationState(&local_808,pVVar14);
        state_08.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
             (pointer)psVar26;
        state_08.super_ValidationState<TxValidationResult>._0_8_ = this_03;
        state_08.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length =
             (size_type)nFeePaid;
        state_08.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity._0_4_ = (int)txns;
        state_08.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity._4_4_ = (int)((ulong)txns >> 0x20);
        state_08.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ = args;
        state_08.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
             (pointer)__return_storage_ptr__;
        state_08.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length =
             (size_type)replaced_txns;
        state_08.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
        _M_allocated_capacity = vsize;
        state_08.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
             in_stack_fffffffffffff668;
        MempoolAcceptResult::Failure((MempoolAcceptResult *)&result,state_08);
        std::
        _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
        ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                  ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                    *)&results,(transaction_identifier<true> *)(lVar28 + 0x59),
                   (MempoolAcceptResult *)&result);
        MempoolAcceptResult::~MempoolAcceptResult((MempoolAcceptResult *)&result);
        ValidationState<TxValidationResult>::~ValidationState(&local_808);
        pVVar21 = &local_850;
        ValidationState<PackageValidationResult>::ValidationState
                  (pVVar21,&package_state.super_ValidationState<PackageValidationResult>);
        state_09.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
             (pointer)psVar26;
        state_09.super_ValidationState<PackageValidationResult>._0_8_ = this_03;
        state_09.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
             (size_type)nFeePaid;
        state_09.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity._0_4_ = (int)txns;
        state_09.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity._4_4_ = (int)((ulong)txns >> 0x20);
        state_09.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ = args
        ;
        state_09.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
             (pointer)__return_storage_ptr__;
        state_09.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
             (size_type)replaced_txns;
        state_09.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
        _M_allocated_capacity = vsize;
        state_09.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
             in_stack_fffffffffffff668;
        PackageMempoolAcceptResult::PackageMempoolAcceptResult
                  (__return_storage_ptr__,state_09,
                   (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                    *)pVVar21);
        goto LAB_003727e1;
      }
      pWVar12 = extraout_RDX_04;
      if (args->m_test_accept == true) {
        if (args->m_package_feerates == true) {
          err_string.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p =
               (_Alloc_hider)pVVar14[-1].m_debug_message._M_string_length;
          bVar8 = 1;
        }
        else {
          CFeeRate::CFeeRate((CFeeRate *)&err_string,(CAmount *)&pVVar14[-1].m_debug_message,
                             *(uint32_t *)&pVVar14[-1].m_reject_reason.field_2);
          bVar8 = args->m_package_feerates;
        }
        if ((bVar8 & 1) == 0) {
          lVar28 = **(long **)&pVVar14[-1].m_debug_message.field_2;
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
               *(undefined8 *)(lVar28 + 0x59);
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_8_ =
               *(undefined8 *)(lVar28 + 0x61);
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._16_8_ =
               *(undefined8 *)(lVar28 + 0x69);
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._24_8_ =
               *(undefined8 *)(lVar28 + 0x71);
          __l_00._M_len = 1;
          __l_00._M_array = (iterator)&result;
          std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
          ::vector((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                    *)&err,__l_00,(allocator_type *)&local_f0);
        }
        else {
          std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
          ::vector((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                    *)&err,&all_package_wtxids);
        }
        lVar28 = **(long **)&pVVar14[-1].m_debug_message.field_2;
        MempoolAcceptResult::MempoolAcceptResult
                  ((MempoolAcceptResult *)&result,
                   (list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    *)replaced_txns,pVVar14[-1].m_reject_reason.field_2._M_allocated_capacity,
                   *(CAmount *)((long)&pVVar14[-1].m_reject_reason.field_2 + 8),
                   (CFeeRate)
                   err_string.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload._M_value._M_dataplus._M_p,
                   (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                    *)&err);
        std::
        _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
        ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                  ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                    *)&results,(transaction_identifier<true> *)(lVar28 + 0x59),
                   (MempoolAcceptResult *)&result);
        MempoolAcceptResult::~MempoolAcceptResult((MempoolAcceptResult *)&result);
        std::
        _Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
        ~_Vector_base((_Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                       *)&err);
        pWVar12 = extraout_RDX_05;
      }
    }
    if (args->m_test_accept == true) {
      pVVar21 = &local_898;
      ValidationState<PackageValidationResult>::ValidationState
                (pVVar21,&package_state.super_ValidationState<PackageValidationResult>);
      state_07.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
           (pointer)psVar26;
      state_07.super_ValidationState<PackageValidationResult>._0_8_ = this_03;
      state_07.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
           (size_type)nFeePaid;
      state_07.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
      _M_allocated_capacity._0_4_ = (int)txns;
      state_07.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
      _M_allocated_capacity._4_4_ = (int)((ulong)txns >> 0x20);
      state_07.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ = args;
      state_07.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
           (pointer)__return_storage_ptr__;
      state_07.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
           (size_type)replaced_txns;
      state_07.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
      _M_allocated_capacity = vsize;
      state_07.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
           in_stack_fffffffffffff668;
      PackageMempoolAcceptResult::PackageMempoolAcceptResult
                (__return_storage_ptr__,state_07,
                 (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                  *)pVVar21);
    }
    else {
      lVar17 = (long)local_968.
                     super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_968.
                     super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      limits = (string *)0x240;
      __it_00._M_current =
           local_968.
           super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
           ._M_impl.super__Vector_impl_data._M_start;
      pWVar16 = local_968.
                super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ = this_03;
      for (lVar28 = lVar17 / 0x240 >> 2; _Var20._M_current = __it_00._M_current, 0 < lVar28;
          lVar28 = lVar28 + -1) {
        bVar7 = __gnu_cxx::__ops::
                _Iter_negate<(anonymous_namespace)::MemPoolAccept::SubmitPackage((anonymous_namespace)::MemPoolAccept::ATMPArgs_const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,PackageValidationState&,std::map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>&)::$_0>
                ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::SubmitPackage((anonymous_namespace)::MemPoolAccept::ATMPArgs_const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,PackageValidationState&,std::map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>&)::__0>
                              *)&result,__it_00);
        pWVar12 = extraout_RDX_06;
        if (bVar7) goto LAB_0037209e;
        bVar7 = __gnu_cxx::__ops::
                _Iter_negate<(anonymous_namespace)::MemPoolAccept::SubmitPackage((anonymous_namespace)::MemPoolAccept::ATMPArgs_const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,PackageValidationState&,std::map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>&)::$_0>
                ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::SubmitPackage((anonymous_namespace)::MemPoolAccept::ATMPArgs_const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,PackageValidationState&,std::map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>&)::__0>
                              *)&result,__it_00._M_current + 1);
        pWVar12 = extraout_RDX_07;
        _Var20._M_current = __it_00._M_current + 1;
        if (bVar7) goto LAB_0037209e;
        bVar7 = __gnu_cxx::__ops::
                _Iter_negate<(anonymous_namespace)::MemPoolAccept::SubmitPackage((anonymous_namespace)::MemPoolAccept::ATMPArgs_const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,PackageValidationState&,std::map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>&)::$_0>
                ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::SubmitPackage((anonymous_namespace)::MemPoolAccept::ATMPArgs_const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,PackageValidationState&,std::map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>&)::__0>
                              *)&result,__it_00._M_current + 2);
        pWVar12 = extraout_RDX_08;
        _Var20._M_current = __it_00._M_current + 2;
        if (bVar7) goto LAB_0037209e;
        bVar7 = __gnu_cxx::__ops::
                _Iter_negate<(anonymous_namespace)::MemPoolAccept::SubmitPackage((anonymous_namespace)::MemPoolAccept::ATMPArgs_const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,PackageValidationState&,std::map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>&)::$_0>
                ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::SubmitPackage((anonymous_namespace)::MemPoolAccept::ATMPArgs_const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,PackageValidationState&,std::map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>&)::__0>
                              *)&result,__it_00._M_current + 3);
        pWVar12 = extraout_RDX_09;
        _Var20._M_current = __it_00._M_current + 3;
        if (bVar7) goto LAB_0037209e;
        __it_00._M_current = __it_00._M_current + 4;
        lVar17 = lVar17 + -0x900;
      }
      limits = (string *)0x240;
      lVar28 = lVar17 / 0x240;
      pWVar12 = (Workspace *)(lVar17 % 0x240);
      if (lVar28 == 1) {
LAB_003729d4:
        bVar7 = __gnu_cxx::__ops::
                _Iter_negate<(anonymous_namespace)::MemPoolAccept::SubmitPackage((anonymous_namespace)::MemPoolAccept::ATMPArgs_const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,PackageValidationState&,std::map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>&)::$_0>
                ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::SubmitPackage((anonymous_namespace)::MemPoolAccept::ATMPArgs_const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,PackageValidationState&,std::map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>&)::__0>
                              *)&result,__it_00);
        pWVar12 = extraout_RDX_14;
        _Var20._M_current = __it_00._M_current;
        if (!bVar7) {
          _Var20._M_current = pWVar16;
        }
LAB_0037209e:
        if (_Var20._M_current != pWVar16) {
          __assert_fail("std::all_of(workspaces.cbegin(), workspaces.cend(), [this](const auto& ws){ return !m_pool.exists(GenTxid::Txid(ws.m_ptx->GetHash())); })"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x547,
                        "bool (anonymous namespace)::MemPoolAccept::SubmitPackage(const ATMPArgs &, std::vector<Workspace> &, PackageValidationState &, std::map<uint256, MempoolAcceptResult> &)"
                       );
        }
      }
      else {
        if (lVar28 == 2) {
LAB_00372074:
          bVar7 = __gnu_cxx::__ops::
                  _Iter_negate<(anonymous_namespace)::MemPoolAccept::SubmitPackage((anonymous_namespace)::MemPoolAccept::ATMPArgs_const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,PackageValidationState&,std::map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>&)::$_0>
                  ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::SubmitPackage((anonymous_namespace)::MemPoolAccept::ATMPArgs_const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,PackageValidationState&,std::map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>&)::__0>
                                *)&result,__it_00);
          pWVar12 = extraout_RDX_11;
          _Var20._M_current = __it_00._M_current;
          if (!bVar7) {
            __it_00._M_current = __it_00._M_current + 1;
            goto LAB_003729d4;
          }
          goto LAB_0037209e;
        }
        if (lVar28 == 3) {
          bVar7 = __gnu_cxx::__ops::
                  _Iter_negate<(anonymous_namespace)::MemPoolAccept::SubmitPackage((anonymous_namespace)::MemPoolAccept::ATMPArgs_const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,PackageValidationState&,std::map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>&)::$_0>
                  ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::SubmitPackage((anonymous_namespace)::MemPoolAccept::ATMPArgs_const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,PackageValidationState&,std::map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>&)::__0>
                                *)&result,__it_00);
          pWVar12 = extraout_RDX_10;
          if (!bVar7) {
            __it_00._M_current = __it_00._M_current + 1;
            goto LAB_00372074;
          }
          goto LAB_0037209e;
        }
      }
      pVVar14 = &(pWVar11->m_state).super_ValidationState<TxValidationResult>;
      uVar30 = CONCAT71((int7)((ulong)pWVar11 >> 8),1);
      while( true ) {
        pWVar11 = local_968.
                  super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar34 = (undefined4)((ulong)txns >> 0x20);
        ws_00 = &pVVar14[-3].m_reject_reason;
        if ((pointer)ws_00 == pWVar16) break;
        bVar7 = ConsensusScriptChecks(this_03,(ATMPArgs *)ws_00,pWVar12);
        if (!bVar7) {
          lVar28 = **(long **)&pVVar14[-1].m_debug_message.field_2;
          ValidationState<TxValidationResult>::ValidationState
                    ((ValidationState<TxValidationResult> *)&err,pVVar14);
          state_11.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
               (pointer)psVar26;
          state_11.super_ValidationState<TxValidationResult>._0_8_ = this_03;
          state_11.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length =
               (size_type)pWVar16;
          state_11.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity._0_4_ = (int)txns;
          state_11.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity._4_4_ = (int)((ulong)txns >> 0x20);
          state_11.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ = args;
          state_11.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
               (pointer)__return_storage_ptr__;
          state_11.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length =
               (size_type)replaced_txns;
          state_11.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
          _M_allocated_capacity = vsize;
          state_11.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
               in_stack_fffffffffffff668;
          MempoolAcceptResult::Failure((MempoolAcceptResult *)&result,state_11);
          std::
          _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
          ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                    ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                      *)&results,(transaction_identifier<true> *)(lVar28 + 0x59),
                     (MempoolAcceptResult *)&result);
          MempoolAcceptResult::~MempoolAcceptResult((MempoolAcceptResult *)&result);
          ValidationState<TxValidationResult>::~ValidationState
                    ((ValidationState<TxValidationResult> *)&err);
          base_blob<256u>::ToString_abi_cxx11_
                    ((string *)&err_string,
                     (base_blob<256u> *)(**(long **)&pVVar14[-1].m_debug_message.field_2 + 0x39));
          tinyformat::format<std::__cxx11::string>
                    ((string *)&result,
                     (tinyformat *)
                     "BUG! PolicyScriptChecks succeeded but ConsensusScriptChecks failed: %s",
                     (char *)&err_string,limits);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&effective_feerate_wtxids_1,"",(allocator<char> *)&parent_feerate);
          ValidationState<PackageValidationResult>::Invalid
                    (&package_state.super_ValidationState<PackageValidationResult>,
                     PCKG_MEMPOOL_ERROR,(string *)&result,(string *)&effective_feerate_wtxids_1);
          std::__cxx11::string::~string((string *)&effective_feerate_wtxids_1);
          std::__cxx11::string::~string((string *)&result);
          std::__cxx11::string::~string((string *)&err_string);
          uVar30 = 0;
        }
        limits = (string *)&(this_03->m_pool->m_opts).limits;
        CTxMemPool::CalculateMemPoolAncestors
                  ((Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                    *)&err_string,this_03->m_pool,
                   (CTxMemPoolEntry *)pVVar14[-1].m_reject_reason._M_dataplus._M_p,(Limits *)limits,
                   true);
        if (local_68 != '\x01') {
          lVar28 = **(long **)&pVVar14[-1].m_debug_message.field_2;
          ValidationState<TxValidationResult>::ValidationState(&local_f0,pVVar14);
          state_12.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
               (pointer)psVar26;
          state_12.super_ValidationState<TxValidationResult>._0_8_ = this_03;
          state_12.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length =
               (size_type)pWVar16;
          state_12.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity._0_4_ = (int)txns;
          state_12.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity._4_4_ = (int)((ulong)txns >> 0x20);
          state_12.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ = args;
          state_12.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
               (pointer)__return_storage_ptr__;
          state_12.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length =
               (size_type)replaced_txns;
          state_12.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
          _M_allocated_capacity = vsize;
          state_12.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
               in_stack_fffffffffffff668;
          MempoolAcceptResult::Failure((MempoolAcceptResult *)&result,state_12);
          std::
          _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
          ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                    ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                      *)&results,(transaction_identifier<true> *)(lVar28 + 0x59),
                     (MempoolAcceptResult *)&result);
          MempoolAcceptResult::~MempoolAcceptResult((MempoolAcceptResult *)&result);
          ValidationState<TxValidationResult>::~ValidationState(&local_f0);
          base_blob<256u>::ToString_abi_cxx11_
                    ((string *)&effective_feerate_wtxids_1,
                     (base_blob<256u> *)(**(long **)&pVVar14[-1].m_debug_message.field_2 + 0x39));
          tinyformat::format<std::__cxx11::string>
                    ((string *)&result,
                     (tinyformat *)"BUG! Mempool ancestors or descendants were underestimated: %s",
                     (char *)&effective_feerate_wtxids_1,limits);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&parent_feerate,"",(allocator<char> *)&package_feerate_1);
          limits = (string *)&parent_feerate;
          ValidationState<PackageValidationResult>::Invalid
                    (&package_state.super_ValidationState<PackageValidationResult>,
                     PCKG_MEMPOOL_ERROR,(string *)&result,(string *)&parent_feerate);
          std::__cxx11::string::~string((string *)&parent_feerate);
          std::__cxx11::string::~string((string *)&result);
          std::__cxx11::string::~string((string *)&effective_feerate_wtxids_1);
          uVar30 = 0;
        }
        this_04 = (_Rb_tree<_270907ca_> *)((long)&pVVar14[-2].m_reject_reason.field_2 + 8);
        util::
        Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,CompareIteratorByHash,std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>>
        ::
        value_or<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,CompareIteratorByHash,std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>&>
                  ((T *)&result,
                   (_Variant_storage<false,_bilingual_str,_std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                    *)&err_string,
                   (set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                    *)this_04);
        std::_Rb_tree<$270907ca$>::operator=(this_04,(_Rb_tree<_270907ca_> *)&result);
        std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&result);
        std::__detail::__variant::
        _Variant_storage<false,_bilingual_str,_std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
        ::~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                             *)&err_string);
        bVar7 = Finalize(this_03,args,(Workspace *)ws_00);
        pWVar12 = extraout_RDX_12;
        if (!bVar7) {
          lVar28 = **(long **)&pVVar14[-1].m_debug_message.field_2;
          ValidationState<TxValidationResult>::ValidationState(&local_158,pVVar14);
          state_13.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
               (pointer)psVar26;
          state_13.super_ValidationState<TxValidationResult>._0_8_ = this_03;
          state_13.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length =
               (size_type)pWVar16;
          state_13.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity._0_4_ = (int)txns;
          state_13.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity._4_4_ = (int)((ulong)txns >> 0x20);
          state_13.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ = args;
          state_13.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
               (pointer)__return_storage_ptr__;
          state_13.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length =
               (size_type)replaced_txns;
          state_13.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
          _M_allocated_capacity = vsize;
          state_13.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
               in_stack_fffffffffffff668;
          MempoolAcceptResult::Failure((MempoolAcceptResult *)&result,state_13);
          std::
          _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
          ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                    ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                      *)&results,(transaction_identifier<true> *)(lVar28 + 0x59),
                     (MempoolAcceptResult *)&result);
          MempoolAcceptResult::~MempoolAcceptResult((MempoolAcceptResult *)&result);
          ValidationState<TxValidationResult>::~ValidationState(&local_158);
          base_blob<256u>::ToString_abi_cxx11_
                    ((string *)&err_string,
                     (base_blob<256u> *)(**(long **)&pVVar14[-1].m_debug_message.field_2 + 0x39));
          tinyformat::format<std::__cxx11::string>
                    ((string *)&result,(tinyformat *)"BUG! Adding to mempool failed: %s",
                     (char *)&err_string,limits);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&effective_feerate_wtxids_1,"",(allocator<char> *)&parent_feerate);
          limits = (string *)&effective_feerate_wtxids_1;
          ValidationState<PackageValidationResult>::Invalid
                    (&package_state.super_ValidationState<PackageValidationResult>,
                     PCKG_MEMPOOL_ERROR,(string *)&result,(string *)&effective_feerate_wtxids_1);
          std::__cxx11::string::~string((string *)&effective_feerate_wtxids_1);
          std::__cxx11::string::~string((string *)&result);
          std::__cxx11::string::~string((string *)&err_string);
          uVar30 = 0;
          pWVar12 = extraout_RDX_13;
        }
        pVVar14 = pVVar14 + 8;
      }
      err_string.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
      err_string.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_string_length = 0;
      err_string.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._16_8_ = 0;
      pWVar12 = (Workspace *)
                (((long)local_968.
                        super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_968.
                       super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x240);
      pWVar23 = local_968.
                super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
      reserve((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
               *)&err_string,(size_type)pWVar12);
      uVar27 = (uint)uVar30;
      for (pWVar16 = pWVar11; pWVar16 != pWVar23; pWVar16 = pWVar16 + 1) {
        peVar4 = (pWVar16->m_ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
             *(undefined8 *)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
        ;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_8_ =
             *(undefined8 *)
              ((long)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._16_8_ =
             *(undefined8 *)
              ((long)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10
              );
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._24_8_ =
             *(undefined8 *)
              ((long)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18
              );
        std::vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>::
        emplace_back<transaction_identifier<true>>
                  ((vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>
                    *)&err_string,(transaction_identifier<true> *)&result);
      }
      pMVar31 = this_03;
      uVar33 = uVar27;
      if (((((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)&replaced_txns->_M_next)->_M_impl)._M_node.super__List_node_base._M_next !=
           replaced_txns) && (bVar7 = ::LogAcceptCategory(MEMPOOL,Debug), pMVar31 = this_03, bVar7))
      {
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
             (this_03->m_subpackage).m_replaced_transactions.
             super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl._M_node._M_size;
        parent_feerate.nSatoshisPerK =
             (this_03->m_subpackage).m_total_modified_fees -
             (this_03->m_subpackage).m_conflicting_fees;
        package_feerate_1.nSatoshisPerK =
             (this_03->m_subpackage).m_total_vsize -
             (long)(int)(this_03->m_subpackage).m_conflicting_size;
        logging_function._M_str = "SubmitPackage";
        logging_function._M_len = 0xd;
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        source_file._M_len = 0x5e;
        effective_feerate_wtxids_1.
        super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)pWVar12;
        LogPrintFormatInternal<unsigned_long,unsigned_long,long,long>
                  (logging_function,source_file,0x580,MEMPOOL,Debug,
                   (ConstevalFormatString<4U>)0x6c7823,(unsigned_long *)&result,
                   (unsigned_long *)&effective_feerate_wtxids_1,&parent_feerate.nSatoshisPerK,
                   &package_feerate_1.nSatoshisPerK);
        pMVar31 = this_03;
      }
      while( true ) {
        if (pWVar11 == pWVar23) break;
        if (args->m_package_feerates == true) {
          parent_feerate.nSatoshisPerK = (pWVar11->m_package_feerate).nSatoshisPerK;
          bVar8 = 1;
        }
        else {
          CFeeRate::CFeeRate(&parent_feerate,&pWVar11->m_modified_fees,(uint32_t)pWVar11->m_vsize);
          bVar8 = args->m_package_feerates;
        }
        if ((bVar8 & 1) == 0) {
          peVar4 = (pWVar11->m_ptx->
                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
               *(undefined8 *)
                (peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_8_ =
               *(undefined8 *)
                ((long)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8)
          ;
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._16_8_ =
               *(undefined8 *)
                ((long)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                0x10);
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._24_8_ =
               *(undefined8 *)
                ((long)(peVar4->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                0x18);
          __l_01._M_len = 1;
          __l_01._M_array = (iterator)&result;
          std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
          ::vector(&effective_feerate_wtxids_1,__l_01,(allocator_type *)&package_feerate_1);
        }
        else {
          std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
          ::vector(&effective_feerate_wtxids_1,
                   (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                    *)&err_string);
        }
        peVar4 = (pWVar11->m_ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        MempoolAcceptResult::MempoolAcceptResult
                  ((MempoolAcceptResult *)&result,
                   (list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    *)replaced_txns,pWVar11->m_vsize,pWVar11->m_base_fees,parent_feerate,
                   &effective_feerate_wtxids_1);
        std::
        _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
        ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                  ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                    *)&results,&peVar4->m_witness_hash,(MempoolAcceptResult *)&result);
        MempoolAcceptResult::~MempoolAcceptResult((MempoolAcceptResult *)&result);
        if ((this_03->m_pool->m_opts).signals != (ValidationSignals *)0x0) {
          tx = pWVar11->m_ptx;
          tx_00 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          vsize = pWVar11->m_vsize;
          uVar27 = ((pWVar11->m_entry)._M_t.
                    super___uniq_ptr_impl<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_CTxMemPoolEntry_*,_std::default_delete<CTxMemPoolEntry>_>
                    .super__Head_base<0UL,_CTxMemPoolEntry_*,_false>._M_head_impl)->entryHeight;
          bVar7 = args->m_bypass_limits;
          bVar9 = args->m_package_submission;
          chainstate_is_current = IsCurrentForFeeEstimation(this_03->m_active_chainstate);
          has_no_mempool_parents = CTxMemPool::HasNoInputsOf(pMVar31->m_pool,tx_00);
          this_03 = pMVar31;
          NewMempoolTransactionInfo::NewMempoolTransactionInfo
                    ((NewMempoolTransactionInfo *)&result,tx,&pWVar11->m_base_fees,vsize,uVar27,
                     bVar7,bVar9,chainstate_is_current,has_no_mempool_parents);
          pCVar5 = this_03->m_pool;
          mempool_sequence = pCVar5->m_sequence_number;
          this_01 = (pCVar5->m_opts).signals;
          pCVar5->m_sequence_number = mempool_sequence + 1;
          pMVar31 = this_03;
          ValidationSignals::TransactionAddedToMempool
                    (this_01,(NewMempoolTransactionInfo *)&result,mempool_sequence);
          uVar27 = uVar33;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                             super__Move_assign_alias<bilingual_str,_std::monostate>.
                             super__Copy_assign_alias<bilingual_str,_std::monostate>.
                             super__Move_ctor_alias<bilingual_str,_std::monostate>.
                             super__Copy_ctor_alias<bilingual_str,_std::monostate> + 8));
          pWVar12 = pWVar11;
          uVar33 = uVar27;
        }
        std::
        _Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
        ~_Vector_base(&effective_feerate_wtxids_1.
                       super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                     );
        pWVar11 = pWVar11 + 1;
      }
      std::
      _Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
      ~_Vector_base((_Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                     *)&err_string);
      if ((uVar27 & 1) == 0) {
        pVVar21 = &local_8e0;
        ValidationState<PackageValidationResult>::ValidationState
                  (pVVar21,&package_state.super_ValidationState<PackageValidationResult>);
        state_15.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
             (pointer)pWVar12;
        state_15.super_ValidationState<PackageValidationResult>._0_8_ = pMVar31;
        state_15.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
             (size_type)pWVar23;
        state_15.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity._0_4_ = uVar33;
        state_15.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity._4_4_ = uVar34;
        state_15.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ = args
        ;
        state_15.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
             (pointer)__return_storage_ptr__;
        state_15.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
             (size_type)replaced_txns;
        state_15.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
        _M_allocated_capacity = vsize;
        state_15.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
             in_stack_fffffffffffff668;
        PackageMempoolAcceptResult::PackageMempoolAcceptResult
                  (__return_storage_ptr__,state_15,
                   (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                    *)pVVar21);
      }
      else {
        pVVar21 = &local_928;
        ValidationState<PackageValidationResult>::ValidationState
                  (pVVar21,&package_state.super_ValidationState<PackageValidationResult>);
        state_14.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
             (pointer)pWVar12;
        state_14.super_ValidationState<PackageValidationResult>._0_8_ = pMVar31;
        state_14.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
             (size_type)pWVar23;
        state_14.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity._0_4_ = uVar33;
        state_14.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity._4_4_ = uVar34;
        state_14.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ = args
        ;
        state_14.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
             (pointer)__return_storage_ptr__;
        state_14.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
             (size_type)replaced_txns;
        state_14.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
        _M_allocated_capacity = vsize;
        state_14.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
             in_stack_fffffffffffff668;
        PackageMempoolAcceptResult::PackageMempoolAcceptResult
                  (__return_storage_ptr__,state_14,
                   (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                    *)pVVar21);
      }
    }
  }
LAB_003727e1:
  ValidationState<PackageValidationResult>::~ValidationState(pVVar21);
  ValidationState<TxValidationResult>::~ValidationState
            (&placeholder_state.super_ValidationState<TxValidationResult>);
  std::_Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
  ~_Vector_base(&all_package_wtxids.
                 super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
               );
LAB_00372805:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock8.super_unique_lock);
  std::
  _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  ::~_Rb_tree(&results._M_t);
  std::
  vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
  ::~vector(&local_968);
LAB_00372829:
  ValidationState<PackageValidationResult>::~ValidationState
            (&package_state.super_ValidationState<PackageValidationResult>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return __return_storage_ptr__;
  }
LAB_00373724:
  __stack_chk_fail();
}

Assistant:

PackageMempoolAcceptResult MemPoolAccept::AcceptMultipleTransactions(const std::vector<CTransactionRef>& txns, ATMPArgs& args)
{
    AssertLockHeld(cs_main);

    // These context-free package limits can be done before taking the mempool lock.
    PackageValidationState package_state;
    if (!IsWellFormedPackage(txns, package_state, /*require_sorted=*/true)) return PackageMempoolAcceptResult(package_state, {});

    std::vector<Workspace> workspaces{};
    workspaces.reserve(txns.size());
    std::transform(txns.cbegin(), txns.cend(), std::back_inserter(workspaces),
                   [](const auto& tx) { return Workspace(tx); });
    std::map<uint256, MempoolAcceptResult> results;

    LOCK(m_pool.cs);

    // Do all PreChecks first and fail fast to avoid running expensive script checks when unnecessary.
    for (Workspace& ws : workspaces) {
        if (!PreChecks(args, ws)) {
            package_state.Invalid(PackageValidationResult::PCKG_TX, "transaction failed");
            // Exit early to avoid doing pointless work. Update the failed tx result; the rest are unfinished.
            results.emplace(ws.m_ptx->GetWitnessHash(), MempoolAcceptResult::Failure(ws.m_state));
            return PackageMempoolAcceptResult(package_state, std::move(results));
        }

        // Individual modified feerate exceeded caller-defined max; abort
        // N.B. this doesn't take into account CPFPs. Chunk-aware validation may be more robust.
        if (args.m_client_maxfeerate && CFeeRate(ws.m_modified_fees, ws.m_vsize) > args.m_client_maxfeerate.value()) {
            // Need to set failure here both individually and at package level
            ws.m_state.Invalid(TxValidationResult::TX_MEMPOOL_POLICY, "max feerate exceeded", "");
            package_state.Invalid(PackageValidationResult::PCKG_TX, "transaction failed");
            // Exit early to avoid doing pointless work. Update the failed tx result; the rest are unfinished.
            results.emplace(ws.m_ptx->GetWitnessHash(), MempoolAcceptResult::Failure(ws.m_state));
            return PackageMempoolAcceptResult(package_state, std::move(results));
        }

        // Make the coins created by this transaction available for subsequent transactions in the
        // package to spend. If there are no conflicts within the package, no transaction can spend a coin
        // needed by another transaction in the package. We also need to make sure that no package
        // tx replaces (or replaces the ancestor of) the parent of another package tx. As long as we
        // check these two things, we don't need to track the coins spent.
        // If a package tx conflicts with a mempool tx, PackageMempoolChecks() ensures later that any package RBF attempt
        // has *no* in-mempool ancestors, so we don't have to worry about subsequent transactions in
        // same package spending the same in-mempool outpoints. This needs to be revisited for general
        // package RBF.
        m_viewmempool.PackageAddTransaction(ws.m_ptx);
    }

    // At this point we have all in-mempool ancestors, and we know every transaction's vsize.
    // Run the TRUC checks on the package.
    for (Workspace& ws : workspaces) {
        if (auto err{PackageTRUCChecks(ws.m_ptx, ws.m_vsize, txns, ws.m_ancestors)}) {
            package_state.Invalid(PackageValidationResult::PCKG_POLICY, "TRUC-violation", err.value());
            return PackageMempoolAcceptResult(package_state, {});
        }
    }

    // Transactions must meet two minimum feerates: the mempool minimum fee and min relay fee.
    // For transactions consisting of exactly one child and its parents, it suffices to use the
    // package feerate (total modified fees / total virtual size) to check this requirement.
    // Note that this is an aggregate feerate; this function has not checked that there are transactions
    // too low feerate to pay for themselves, or that the child transactions are higher feerate than
    // their parents. Using aggregate feerate may allow "parents pay for child" behavior and permit
    // a child that is below mempool minimum feerate. To avoid these behaviors, callers of
    // AcceptMultipleTransactions need to restrict txns topology (e.g. to ancestor sets) and check
    // the feerates of individuals and subsets.
    m_subpackage.m_total_vsize = std::accumulate(workspaces.cbegin(), workspaces.cend(), int64_t{0},
        [](int64_t sum, auto& ws) { return sum + ws.m_vsize; });
    m_subpackage.m_total_modified_fees = std::accumulate(workspaces.cbegin(), workspaces.cend(), CAmount{0},
        [](CAmount sum, auto& ws) { return sum + ws.m_modified_fees; });
    const CFeeRate package_feerate(m_subpackage.m_total_modified_fees, m_subpackage.m_total_vsize);
    std::vector<Wtxid> all_package_wtxids;
    all_package_wtxids.reserve(workspaces.size());
    std::transform(workspaces.cbegin(), workspaces.cend(), std::back_inserter(all_package_wtxids),
                   [](const auto& ws) { return ws.m_ptx->GetWitnessHash(); });
    TxValidationState placeholder_state;
    if (args.m_package_feerates &&
        !CheckFeeRate(m_subpackage.m_total_vsize, m_subpackage.m_total_modified_fees, placeholder_state)) {
        package_state.Invalid(PackageValidationResult::PCKG_TX, "transaction failed");
        return PackageMempoolAcceptResult(package_state, {{workspaces.back().m_ptx->GetWitnessHash(),
            MempoolAcceptResult::FeeFailure(placeholder_state, CFeeRate(m_subpackage.m_total_modified_fees, m_subpackage.m_total_vsize), all_package_wtxids)}});
    }

    // Apply package mempool ancestor/descendant limits. Skip if there is only one transaction,
    // because it's unnecessary.
    if (txns.size() > 1 && !PackageMempoolChecks(txns, workspaces, m_subpackage.m_total_vsize, package_state)) {
        return PackageMempoolAcceptResult(package_state, std::move(results));
    }

    for (Workspace& ws : workspaces) {
        ws.m_package_feerate = package_feerate;
        if (!PolicyScriptChecks(args, ws)) {
            // Exit early to avoid doing pointless work. Update the failed tx result; the rest are unfinished.
            package_state.Invalid(PackageValidationResult::PCKG_TX, "transaction failed");
            results.emplace(ws.m_ptx->GetWitnessHash(), MempoolAcceptResult::Failure(ws.m_state));
            return PackageMempoolAcceptResult(package_state, std::move(results));
        }
        if (args.m_test_accept) {
            const auto effective_feerate = args.m_package_feerates ? ws.m_package_feerate :
                CFeeRate{ws.m_modified_fees, static_cast<uint32_t>(ws.m_vsize)};
            const auto effective_feerate_wtxids = args.m_package_feerates ? all_package_wtxids :
                std::vector<Wtxid>{ws.m_ptx->GetWitnessHash()};
            results.emplace(ws.m_ptx->GetWitnessHash(),
                            MempoolAcceptResult::Success(std::move(m_subpackage.m_replaced_transactions),
                                                         ws.m_vsize, ws.m_base_fees, effective_feerate,
                                                         effective_feerate_wtxids));
        }
    }

    if (args.m_test_accept) return PackageMempoolAcceptResult(package_state, std::move(results));

    if (!SubmitPackage(args, workspaces, package_state, results)) {
        // PackageValidationState filled in by SubmitPackage().
        return PackageMempoolAcceptResult(package_state, std::move(results));
    }

    return PackageMempoolAcceptResult(package_state, std::move(results));
}